

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O1

void ScaleRowDown4Box_16_C(uint16_t *src_ptr,ptrdiff_t src_stride,uint16_t *dst,int dst_width)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  undefined1 auVar13 [14];
  undefined1 auVar14 [14];
  undefined1 auVar15 [14];
  undefined1 auVar16 [14];
  undefined1 auVar17 [14];
  undefined1 auVar18 [14];
  undefined1 auVar19 [14];
  long lVar20;
  int iVar21;
  long lVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  
  if (1 < dst_width) {
    lVar22 = 0;
    lVar20 = 0;
    iVar21 = 0;
    do {
      *(short *)((long)dst + lVar20) =
           (short)((uint)src_ptr[src_stride * 3 + lVar20 * 2 + 3] +
                   (uint)src_ptr[src_stride * 3 + lVar20 * 2 + 2] +
                   (uint)src_ptr[src_stride * 3 + lVar20 * 2 + 1] +
                   (uint)src_ptr[src_stride * 3 + lVar20 * 2] +
                   (uint)src_ptr[src_stride * 2 + lVar20 * 2 + 3] +
                   (uint)src_ptr[src_stride * 2 + lVar20 * 2 + 2] +
                   (uint)src_ptr[src_stride * 2 + lVar20 * 2 + 1] +
                   (uint)src_ptr[src_stride * 2 + lVar20 * 2] +
                   (uint)src_ptr[src_stride + lVar20 * 2 + 3] +
                   (uint)src_ptr[src_stride + lVar20 * 2 + 2] +
                   (uint)src_ptr[src_stride + lVar20 * 2 + 1] +
                   (uint)src_ptr[src_stride + lVar20 * 2] +
                   (uint)src_ptr[lVar20 * 2 + 3] + (uint)src_ptr[lVar20 * 2 + 2] +
                   (uint)src_ptr[lVar20 * 2 + 1] + (uint)src_ptr[lVar20 * 2] + 8 >> 4);
      *(short *)((long)dst + lVar20 + 2) =
           (short)((uint)src_ptr[src_stride * 3 + lVar20 * 2 + 7] +
                   (uint)src_ptr[src_stride * 3 + lVar20 * 2 + 6] +
                   (uint)src_ptr[src_stride * 3 + lVar20 * 2 + 5] +
                   (uint)src_ptr[src_stride * 3 + lVar20 * 2 + 4] +
                   (uint)src_ptr[src_stride * 2 + lVar20 * 2 + 7] +
                   (uint)src_ptr[src_stride * 2 + lVar20 * 2 + 6] +
                   (uint)src_ptr[src_stride * 2 + lVar20 * 2 + 5] +
                   (uint)src_ptr[src_stride * 2 + lVar20 * 2 + 4] +
                   (uint)src_ptr[src_stride + lVar20 * 2 + 7] +
                   (uint)src_ptr[src_stride + lVar20 * 2 + 6] +
                   (uint)src_ptr[src_stride + lVar20 * 2 + 5] +
                   (uint)src_ptr[src_stride + lVar20 * 2 + 4] +
                   (uint)src_ptr[lVar20 * 2 + 7] + (uint)src_ptr[lVar20 * 2 + 6] +
                   (uint)src_ptr[lVar20 * 2 + 5] + (uint)src_ptr[lVar20 * 2 + 4] + 8 >> 4);
      iVar21 = iVar21 + 2;
      lVar20 = lVar20 + 4;
      lVar22 = lVar22 + 0x10;
    } while (iVar21 < dst_width + -1);
    src_ptr = (uint16_t *)((long)src_ptr + lVar22);
    dst = (uint16_t *)((long)dst + lVar20);
  }
  if ((dst_width & 1U) != 0) {
    uVar1 = *(ulong *)src_ptr;
    auVar8._8_4_ = 0;
    auVar8._0_8_ = uVar1;
    auVar8._12_2_ = (short)(uVar1 >> 0x30);
    auVar12._8_2_ = (short)(uVar1 >> 0x20);
    auVar12._0_8_ = uVar1;
    auVar12._10_4_ = auVar8._10_4_;
    auVar16._6_8_ = 0;
    auVar16._0_6_ = auVar12._8_6_;
    uVar2 = *(ulong *)((long)src_ptr + src_stride * 2);
    uVar23 = (ushort)(uVar2 >> 0x30);
    auVar5._8_4_ = 0;
    auVar5._0_8_ = uVar2;
    auVar5._12_2_ = uVar23;
    auVar9._8_2_ = (short)(uVar2 >> 0x20);
    auVar9._0_8_ = uVar2;
    auVar9._10_4_ = auVar5._10_4_;
    auVar17._6_8_ = 0;
    auVar17._0_6_ = auVar9._8_6_;
    auVar13._4_2_ = (short)(uVar2 >> 0x10);
    auVar13._0_4_ = (uint)uVar2;
    auVar13._6_8_ = SUB148(auVar17 << 0x40,6);
    uVar3 = *(ulong *)((long)src_ptr + src_stride * 4);
    uVar24 = (ushort)(uVar3 >> 0x30);
    auVar6._8_4_ = 0;
    auVar6._0_8_ = uVar3;
    auVar6._12_2_ = uVar24;
    auVar10._8_2_ = (short)(uVar3 >> 0x20);
    auVar10._0_8_ = uVar3;
    auVar10._10_4_ = auVar6._10_4_;
    auVar18._6_8_ = 0;
    auVar18._0_6_ = auVar10._8_6_;
    auVar14._4_2_ = (short)(uVar3 >> 0x10);
    auVar14._0_4_ = (uint)uVar3;
    auVar14._6_8_ = SUB148(auVar18 << 0x40,6);
    uVar4 = *(ulong *)((long)src_ptr + src_stride * 6);
    uVar25 = (ushort)(uVar4 >> 0x30);
    auVar7._8_4_ = 0;
    auVar7._0_8_ = uVar4;
    auVar7._12_2_ = uVar25;
    auVar11._8_2_ = (short)(uVar4 >> 0x20);
    auVar11._0_8_ = uVar4;
    auVar11._10_4_ = auVar7._10_4_;
    auVar19._6_8_ = 0;
    auVar19._0_6_ = auVar11._8_6_;
    auVar15._4_2_ = (short)(uVar4 >> 0x10);
    auVar15._0_4_ = (uint)uVar4;
    auVar15._6_8_ = SUB148(auVar19 << 0x40,6);
    *dst = (uint16_t)
           ((uint)uVar24 + auVar14._4_4_ + auVar10._8_4_ + ((uint)uVar3 & 0xffff) +
            (uint)uVar23 + auVar13._4_4_ + auVar9._8_4_ + ((uint)uVar2 & 0xffff) +
            (auVar8._10_4_ >> 0x10) +
            (int)CONCAT82(SUB148(auVar16 << 0x40,6),(short)(uVar1 >> 0x10)) +
            auVar12._8_4_ + (uint)(ushort)uVar1 +
            (uint)uVar25 + auVar15._4_4_ + auVar11._8_4_ + ((uint)uVar4 & 0xffff) + 8 >> 4);
  }
  return;
}

Assistant:

void ScaleRowDown4Box_16_C(const uint16_t* src_ptr,
                           ptrdiff_t src_stride,
                           uint16_t* dst,
                           int dst_width) {
  intptr_t stride = src_stride;
  int x;
  for (x = 0; x < dst_width - 1; x += 2) {
    dst[0] = (src_ptr[0] + src_ptr[1] + src_ptr[2] + src_ptr[3] +
              src_ptr[stride + 0] + src_ptr[stride + 1] + src_ptr[stride + 2] +
              src_ptr[stride + 3] + src_ptr[stride * 2 + 0] +
              src_ptr[stride * 2 + 1] + src_ptr[stride * 2 + 2] +
              src_ptr[stride * 2 + 3] + src_ptr[stride * 3 + 0] +
              src_ptr[stride * 3 + 1] + src_ptr[stride * 3 + 2] +
              src_ptr[stride * 3 + 3] + 8) >>
             4;
    dst[1] = (src_ptr[4] + src_ptr[5] + src_ptr[6] + src_ptr[7] +
              src_ptr[stride + 4] + src_ptr[stride + 5] + src_ptr[stride + 6] +
              src_ptr[stride + 7] + src_ptr[stride * 2 + 4] +
              src_ptr[stride * 2 + 5] + src_ptr[stride * 2 + 6] +
              src_ptr[stride * 2 + 7] + src_ptr[stride * 3 + 4] +
              src_ptr[stride * 3 + 5] + src_ptr[stride * 3 + 6] +
              src_ptr[stride * 3 + 7] + 8) >>
             4;
    dst += 2;
    src_ptr += 8;
  }
  if (dst_width & 1) {
    dst[0] = (src_ptr[0] + src_ptr[1] + src_ptr[2] + src_ptr[3] +
              src_ptr[stride + 0] + src_ptr[stride + 1] + src_ptr[stride + 2] +
              src_ptr[stride + 3] + src_ptr[stride * 2 + 0] +
              src_ptr[stride * 2 + 1] + src_ptr[stride * 2 + 2] +
              src_ptr[stride * 2 + 3] + src_ptr[stride * 3 + 0] +
              src_ptr[stride * 3 + 1] + src_ptr[stride * 3 + 2] +
              src_ptr[stride * 3 + 3] + 8) >>
             4;
  }
}